

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Gia_Man_t * Lf_ManDeriveMappingCoarse(Lf_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_01;
  char *pcVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Lf_Cut_t *pLVar7;
  bool bVar8;
  int local_bc;
  int local_38;
  int local_34;
  int k;
  int i;
  Lf_Cut_t *pCut;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGia;
  Gia_Man_t *pNew;
  Lf_Man_t *p_local;
  
  p_00 = p->pGia;
  if ((p->pPars->fCutMin == 0) && (p_00->pMuxes != (uint *)0x0)) {
    iVar1 = Gia_ManObjNum(p_00);
    p_01 = Gia_ManStart(iVar1);
    pcVar4 = Abc_UtilStrsav(p_00->pName);
    p_01->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(p_00->pSpec);
    p_01->pSpec = pcVar4;
    iVar1 = Gia_ManObjNum(p_00);
    iVar2 = Gia_ManXorNum(p_00);
    iVar3 = Gia_ManMuxNum(p_00);
    pVVar5 = Vec_IntAlloc(iVar1 + iVar2 * 2 + iVar3 * 2 + (int)p->pPars->Edge +
                          (int)p->pPars->Area * 2 + (int)p->pPars->Mux7 * 4);
    p_01->vMapping = pVVar5;
    pVVar5 = p_01->vMapping;
    iVar1 = Gia_ManObjNum(p_00);
    iVar2 = Gia_ManXorNum(p_00);
    iVar3 = Gia_ManMuxNum(p_00);
    Vec_IntFill(pVVar5,iVar1 + iVar2 * 2 + iVar3 * 2,0);
    pGVar6 = Gia_ManConst0(p_00);
    pGVar6->Value = 0;
    local_34 = 1;
    while( true ) {
      bVar8 = false;
      if (local_34 < p_00->nObjs) {
        pCut = (Lf_Cut_t *)Gia_ManObj(p_00,local_34);
        bVar8 = pCut != (Lf_Cut_t *)0x0;
      }
      if (!bVar8) break;
      iVar1 = Gia_ObjIsCi((Gia_Obj_t *)pCut);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo((Gia_Obj_t *)pCut);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsBuf((Gia_Obj_t *)pCut);
          if (iVar1 == 0) {
            iVar1 = Gia_ObjIsMuxId(p_00,local_34);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjIsXor((Gia_Obj_t *)pCut);
              if (iVar1 == 0) {
                iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pCut);
                iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)pCut);
                iVar1 = Gia_ManAppendAnd(p_01,iVar1,iVar2);
                pCut->Delay = iVar1;
              }
              else {
                iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pCut);
                iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)pCut);
                iVar1 = Gia_ManAppendXor(p_01,iVar1,iVar2);
                pCut->Delay = iVar1;
              }
            }
            else {
              iVar1 = Gia_ObjFanin2Copy(p_00,(Gia_Obj_t *)pCut);
              iVar2 = Gia_ObjFanin1Copy((Gia_Obj_t *)pCut);
              iVar3 = Gia_ObjFanin0Copy((Gia_Obj_t *)pCut);
              iVar1 = Gia_ManAppendMux(p_01,iVar1,iVar2,iVar3);
              pCut->Delay = iVar1;
            }
            iVar1 = Lf_ObjMapRefNum(p,local_34);
            if (iVar1 != 0) {
              pLVar7 = Lf_ObjCutBest(p,local_34);
              pVVar5 = p_01->vMapping;
              iVar1 = Abc_Lit2Var(pCut->Delay);
              iVar2 = Vec_IntSize(p_01->vMapping);
              Vec_IntWriteEntry(pVVar5,iVar1,iVar2);
              Vec_IntPush(p_01->vMapping,*(uint *)&pLVar7->field_0x14 >> 0x18);
              for (local_38 = 0; local_38 < (int)(*(uint *)&pLVar7->field_0x14 >> 0x18);
                  local_38 = local_38 + 1) {
                pVVar5 = p_01->vMapping;
                pGVar6 = Gia_ManObj(p_00,*(int *)((long)&pLVar7[1].Sign + (long)local_38 * 4));
                iVar1 = Abc_Lit2Var(pGVar6->Value);
                Vec_IntPush(pVVar5,iVar1);
              }
              pVVar5 = p_01->vMapping;
              if ((*(uint *)&pLVar7->field_0x14 >> 0x17 & 1) == 0) {
                local_bc = Abc_Lit2Var(pCut->Delay);
              }
              else {
                local_bc = Abc_Lit2Var(pCut->Delay);
                local_bc = -local_bc;
              }
              Vec_IntPush(pVVar5,local_bc);
            }
          }
          else {
            iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pCut);
            iVar1 = Gia_ManAppendBuf(p_01,iVar1);
            pCut->Delay = iVar1;
          }
        }
        else {
          iVar1 = Gia_ObjFanin0Copy((Gia_Obj_t *)pCut);
          iVar1 = Gia_ManAppendCo(p_01,iVar1);
          pCut->Delay = iVar1;
        }
      }
      else {
        iVar1 = Gia_ManAppendCi(p_01);
        pCut->Delay = iVar1;
      }
      local_34 = local_34 + 1;
    }
    iVar1 = Gia_ManRegNum(p_00);
    Gia_ManSetRegNum(p_01,iVar1);
    iVar1 = Vec_IntCap(p_01->vMapping);
    if (iVar1 != 0x10) {
      iVar1 = Vec_IntSize(p_01->vMapping);
      iVar2 = Vec_IntCap(p_01->vMapping);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                      ,0x6ee,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
      }
    }
    return p_01;
  }
  __assert_fail("!p->pPars->fCutMin && pGia->pMuxes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaLf.c"
                ,0x6cc,"Gia_Man_t *Lf_ManDeriveMappingCoarse(Lf_Man_t *)");
}

Assistant:

Gia_Man_t * Lf_ManDeriveMappingCoarse( Lf_Man_t * p )
{
    Gia_Man_t * pNew, * pGia = p->pGia;
    Gia_Obj_t * pObj;
    Lf_Cut_t * pCut;
    int i, k;
    assert( !p->pPars->fCutMin && pGia->pMuxes );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(pGia) );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    // start mapping
    pNew->vMapping = Vec_IntAlloc( Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia) + (int)p->pPars->Edge + 2*(int)p->pPars->Area + 4*(int)p->pPars->Mux7 );
    Vec_IntFill( pNew->vMapping, Gia_ManObjNum(pGia) + 2*Gia_ManXorNum(pGia) + 2*Gia_ManMuxNum(pGia), 0 );
    // process objects
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            { pObj->Value = Gia_ManAppendCi( pNew ); continue; }
        if ( Gia_ObjIsCo(pObj) )
            { pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsBuf(pObj) )
            { pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) ); continue; }
        if ( Gia_ObjIsMuxId(pGia, i) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(pGia, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Lf_ObjMapRefNum(p, i) )
            continue;
        pCut = Lf_ObjCutBest( p, i );
        Vec_IntWriteEntry( pNew->vMapping, Abc_Lit2Var(pObj->Value), Vec_IntSize(pNew->vMapping) );
        Vec_IntPush( pNew->vMapping, pCut->nLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_IntPush( pNew->vMapping, Abc_Lit2Var(Gia_ManObj(pGia, pCut->pLeaves[k])->Value) );
        Vec_IntPush( pNew->vMapping, pCut->fMux7 ? -Abc_Lit2Var(pObj->Value) : Abc_Lit2Var(pObj->Value) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    assert( Vec_IntCap(pNew->vMapping) == 16 || Vec_IntSize(pNew->vMapping) == Vec_IntCap(pNew->vMapping) );
    return pNew;
}